

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O1

int set_state(int i)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = sem_wait((sem_t *)write_sem);
  if (iVar1 == 0) {
    buf->state = i;
    iVar1 = sem_post((sem_t *)write_sem);
    iVar1 = -(uint)(iVar1 != 0);
  }
  else {
    piVar2 = __errno_location();
    iVar1 = (uint)(*piVar2 == 4) * 2 + -1;
  }
  return iVar1;
}

Assistant:

int set_state(int i)
{
    if (sem_wait(write_sem) != 0)
    {
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }
    buf->state = i;
    if (sem_post(write_sem) != 0)
    {
        return -1;
    }
    return 0;
}